

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

xmlRelaxNGParserCtxtPtr xmlRelaxNGNewMemParserCtxt(char *buffer,int size)

{
  xmlRelaxNGParserCtxtPtr __s;
  
  if (size < 1 || buffer == (char *)0x0) {
    __s = (xmlRelaxNGParserCtxtPtr)0x0;
  }
  else {
    __s = (xmlRelaxNGParserCtxtPtr)(*xmlMalloc)(0x110);
    if (__s == (xmlRelaxNGParserCtxtPtr)0x0) {
      __s = (xmlRelaxNGParserCtxtPtr)0x0;
      xmlRngPErrMemory((xmlRelaxNGParserCtxtPtr)0x0);
    }
    else {
      memset(__s,0,0x110);
      __s->buffer = buffer;
      __s->size = size;
    }
  }
  return __s;
}

Assistant:

xmlRelaxNGParserCtxtPtr
xmlRelaxNGNewMemParserCtxt(const char *buffer, int size)
{
    xmlRelaxNGParserCtxtPtr ret;

    if ((buffer == NULL) || (size <= 0))
        return (NULL);

    ret =
        (xmlRelaxNGParserCtxtPtr) xmlMalloc(sizeof(xmlRelaxNGParserCtxt));
    if (ret == NULL) {
        xmlRngPErrMemory(NULL);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlRelaxNGParserCtxt));
    ret->buffer = buffer;
    ret->size = size;
    return (ret);
}